

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void write_frm_crc(FILE *fp,FrmCrc *crc)

{
  uint local_1c;
  RK_U32 loop;
  FrmCrc *crc_local;
  FILE *fp_local;
  
  if (fp != (FILE *)0x0) {
    fprintf((FILE *)fp,"%d,",(ulong)(crc->luma).len);
    for (local_1c = 0; local_1c < (crc->luma).sum_cnt; local_1c = local_1c + 1) {
      fprintf((FILE *)fp," %lx,",(crc->luma).sum[local_1c]);
    }
    fprintf((FILE *)fp," %08x,",(ulong)(crc->luma).vor);
    fprintf((FILE *)fp," %d,",(ulong)(crc->chroma).len);
    for (local_1c = 0; local_1c < (crc->chroma).sum_cnt; local_1c = local_1c + 1) {
      fprintf((FILE *)fp," %lx,",(crc->chroma).sum[local_1c]);
    }
    fprintf((FILE *)fp," %08x\n",(ulong)(crc->chroma).vor);
    fflush((FILE *)fp);
  }
  return;
}

Assistant:

void write_frm_crc(FILE *fp, FrmCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        // luma
        fprintf(fp, "%d,", crc->luma.len);
        for (loop = 0; loop < crc->luma.sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->luma.sum[loop]);
        }
        fprintf(fp, " %08x,", crc->luma.vor);

        // chroma
        fprintf(fp, " %d,", crc->chroma.len);
        for (loop = 0; loop < crc->chroma.sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->chroma.sum[loop]);
        }
        fprintf(fp, " %08x\n", crc->chroma.vor);

        fflush(fp);
    }
}